

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Int FT_Get_Charmap_Index(FT_CharMap charmap)

{
  int local_1c;
  FT_Int i;
  FT_CharMap charmap_local;
  
  if ((charmap == (FT_CharMap)0x0) || (charmap->face == (FT_Face)0x0)) {
    charmap_local._4_4_ = -1;
  }
  else {
    for (local_1c = 0;
        (local_1c < charmap->face->num_charmaps && (charmap->face->charmaps[local_1c] != charmap));
        local_1c = local_1c + 1) {
    }
    charmap_local._4_4_ = local_1c;
  }
  return charmap_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Int )
  FT_Get_Charmap_Index( FT_CharMap  charmap )
  {
    FT_Int  i;


    if ( !charmap || !charmap->face )
      return -1;

    for ( i = 0; i < charmap->face->num_charmaps; i++ )
      if ( charmap->face->charmaps[i] == charmap )
        break;

    FT_ASSERT( i < charmap->face->num_charmaps );

    return i;
  }